

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

TransRepeatRangeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TransRepeatRangeSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SelectorSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,SelectorSyntax **args_2,Token *args_3)

{
  SelectorSyntax *pSVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  TransRepeatRangeSyntax *pTVar17;
  
  pTVar17 = (TransRepeatRangeSyntax *)allocate(this,0x50,8);
  TVar5 = args->kind;
  uVar6 = args->field_0x2;
  NVar7.raw = (args->numFlags).raw;
  uVar8 = args->rawLen;
  pIVar2 = args->info;
  TVar9 = args_1->kind;
  uVar10 = args_1->field_0x2;
  NVar11.raw = (args_1->numFlags).raw;
  uVar12 = args_1->rawLen;
  pIVar3 = args_1->info;
  pSVar1 = *args_2;
  TVar13 = args_3->kind;
  uVar14 = args_3->field_0x2;
  NVar15.raw = (args_3->numFlags).raw;
  uVar16 = args_3->rawLen;
  pIVar4 = args_3->info;
  (pTVar17->super_SyntaxNode).kind = TransRepeatRange;
  (pTVar17->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pTVar17->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pTVar17->openBracket).kind = TVar5;
  (pTVar17->openBracket).field_0x2 = uVar6;
  (pTVar17->openBracket).numFlags = (NumericTokenFlags)NVar7.raw;
  (pTVar17->openBracket).rawLen = uVar8;
  (pTVar17->openBracket).info = pIVar2;
  (pTVar17->specifier).kind = TVar9;
  (pTVar17->specifier).field_0x2 = uVar10;
  (pTVar17->specifier).numFlags = (NumericTokenFlags)NVar11.raw;
  (pTVar17->specifier).rawLen = uVar12;
  (pTVar17->specifier).info = pIVar3;
  pTVar17->selector = pSVar1;
  (pTVar17->closeBracket).kind = TVar13;
  (pTVar17->closeBracket).field_0x2 = uVar14;
  (pTVar17->closeBracket).numFlags = (NumericTokenFlags)NVar15.raw;
  (pTVar17->closeBracket).rawLen = uVar16;
  (pTVar17->closeBracket).info = pIVar4;
  if (pSVar1 != (SelectorSyntax *)0x0) {
    (pSVar1->super_SyntaxNode).parent = (SyntaxNode *)pTVar17;
  }
  return pTVar17;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }